

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

void inven_drop(object *obj,wchar_t amt)

{
  ushort uVar1;
  loc grid;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  _Bool _Var5;
  char cVar6;
  uint16_t uVar7;
  ulong uVar8;
  object *obj_00;
  ulong uVar9;
  object **ppoVar10;
  char cVar11;
  uint uVar12;
  char *fmt;
  ulong uVar13;
  _Bool none_left;
  object *first;
  object *dropped;
  char name [80];
  _Bool local_9e;
  char local_9d;
  uint local_9c;
  object *local_98;
  object *local_90;
  char local_88 [88];
  
  local_9e = false;
  if (amt < L'\x01') {
    return;
  }
  _Var5 = pile_contains(player->gear,obj);
  if (!_Var5) {
    return;
  }
  local_9d = gear_to_label(player,obj);
  uVar9 = (ulong)z_info->quiver_size;
  uVar8 = 0;
  if (uVar9 == 0) {
    local_9c = 0;
  }
  else {
    ppoVar10 = player->upkeep->quiver;
    bVar2 = (byte)(z_info->quiver_size >> 8);
    if (*ppoVar10 == obj) {
      local_9c = (uint)CONCAT71((uint7)bVar2,1);
    }
    else {
      uVar4 = 1;
      do {
        uVar13 = uVar4;
        if (uVar9 == uVar13) break;
        uVar4 = uVar13 + 1;
      } while (ppoVar10[uVar13] != obj);
      local_9c = (uint)CONCAT11(bVar2,uVar13 < uVar9);
    }
  }
  if ((int)(uint)obj->number < amt) {
    amt = (uint)obj->number;
  }
  uVar1 = (player->body).count;
  if (uVar1 == 0) {
LAB_001965ab:
    if ((int)uVar8 < (int)(uint)uVar1) {
      inven_takeoff(obj);
      bVar3 = true;
      goto LAB_001965c3;
    }
  }
  else {
    ppoVar10 = &((player->body).slots)->obj;
    uVar8 = 0;
    do {
      if (*ppoVar10 == obj) goto LAB_001965ab;
      uVar8 = uVar8 + 1;
      ppoVar10 = ppoVar10 + 4;
    } while ((uint)uVar1 != uVar8);
  }
  bVar3 = false;
LAB_001965c3:
  obj_00 = gear_object_for_use(player,obj,amt,false,&local_9e);
  local_90 = obj_00;
  object_desc(local_88,0x50,obj_00,0x43,player);
  uVar12 = (uint)local_9d;
  msg("You drop %s (%c).",local_88,(ulong)uVar12);
  if (obj_00->artifact == (artifact *)0x0) {
    if ((((bVar3) || (_Var5 = tval_can_have_charges(obj), _Var5)) ||
        (_Var5 = tval_is_rod(obj), _Var5)) || (0 < obj->timeout)) {
      local_98 = (object *)0x0;
      if (local_9e == false) {
        uVar7 = (uint16_t)obj->number;
        obj_00 = obj;
      }
      else {
        uVar7 = 0;
      }
    }
    else {
      uVar7 = object_pack_total(player,obj,false,&local_98);
      if (uVar7 != 0) {
        obj_00 = obj;
      }
    }
    cVar11 = (char)local_9c;
    object_desc(local_88,0x50,obj_00,(uint)uVar7 << 0x10 | 0x443,player);
    if (local_98 == (object *)0x0) {
      fmt = "You have %s (%c).";
    }
    else {
      cVar6 = gear_to_label(player,local_98);
      uVar12 = (uint)cVar6;
      if (local_98->number < uVar7) {
        fmt = "You have %s (1st %c).";
      }
      else {
        fmt = "You have %s (%c).";
      }
    }
    msg(fmt,local_88,(ulong)uVar12);
  }
  else {
    object_desc(local_88,0x50,obj_00,0x13,player);
    msg("You no longer have the %s (%c).",local_88,(ulong)uVar12);
    cVar11 = (char)local_9c;
  }
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  drop_near((chunk *)cave,&local_90,L'\0',grid,false,true);
  if (cVar11 != '\0') {
    sound(0x81);
  }
  event_signal(EVENT_INVENTORY);
  event_signal(EVENT_EQUIPMENT);
  return;
}

Assistant:

void inven_drop(struct object *obj, int amt)
{
	struct object *dropped;
	bool none_left = false;
	bool equipped = false;
	bool quiver;

	char name[80];
	char label;

	/* Error check */
	if (amt <= 0)
		return;

	/* Check it is still held, in case there were two drop commands queued
	 * for this item.  This is in theory not ideal, but in practice should
	 * be safe. */
	if (!object_is_carried(player, obj))
		return;

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Is it in the quiver? */
	quiver = object_is_in_quiver(player, obj);

	/* Not too many */
	if (amt > obj->number) amt = obj->number;

	/* Take off equipment, don't combine */
	if (object_is_equipped(player->body, obj)) {
		equipped = true;
		inven_takeoff(obj);
	}

	/* Get the object */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe the dropped object */
	object_desc(name, sizeof(name), dropped, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s (%c).", name, label);

	/* Describe what's left */
	if (dropped->artifact) {
		object_desc(name, sizeof(name), dropped,
			ODESC_FULL | ODESC_SINGULAR, player);
		msg("You no longer have the %s (%c).", name, label);
	} else {
		struct object *first;
		struct object *desc_target;
		uint16_t total;

		/*
		 * Like gear_object_for_use(), don't show an aggregate total
		 * if it was equipped or the item has charges/recharging
		 * notice that is specific to the stack.
		 */
		if (equipped || tval_can_have_charges(obj) || tval_is_rod(obj)
				|| obj->timeout > 0) {
			first = NULL;
			if (none_left) {
				total = 0;
				desc_target = dropped;
			} else {
				total = obj->number;
				desc_target = obj;
			}
		} else {
			total = object_pack_total(player, obj, false, &first);
			desc_target = (total) ? obj : dropped;
		}

		object_desc(name, sizeof(name), desc_target,
			ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
			(total << 16), player);
		if (!first) {
			msg("You have %s (%c).", name, label);
		} else {
			label = gear_to_label(player, first);
			if (total > first->number) {
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		}
	}

	/* Drop it near the player */
	drop_near(cave, &dropped, 0, player->grid, false, true);

	/* Sound for quiver objects */
	if (quiver)
		sound(MSG_QUIVER);

	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}